

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateBlockBuilder.cpp
# Opt level: O2

bool __thiscall anon_unknown.dwarf_64d2c::StateBlockBuilder::activate(StateBlockBuilder *this)

{
  __shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  (this->super_AppState).m_completed = false;
  local_18._M_ptr = (element_type *)0x0;
  local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_nextState).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>,&local_18
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  return true;
}

Assistant:

virtual bool activate() override
    {
        m_completed = false;
        m_nextState = {};
        return true;
    }